

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O1

void __thiscall Assimp::D3MF::D3MFExporter::exportContentTyp(D3MFExporter *this,string *filename)

{
  pointer pcVar1;
  runtime_error *this_00;
  string entry;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  if (this->m_zipArchive != (zip_t *)0x0) {
    pcVar1 = (filename->_M_dataplus)._M_p;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar1,pcVar1 + filename->_M_string_length);
    zip_entry_open(this->m_zipArchive,(char *)local_60[0]);
    std::__cxx11::stringbuf::str();
    zip_entry_write(this->m_zipArchive,local_40,local_38);
    zip_entry_close(this->m_zipArchive);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"3MF-Export: Zip archive not valid, nullptr.","");
  std::runtime_error::runtime_error(this_00,(string *)local_60);
  *(undefined ***)this_00 = &PTR__runtime_error_007fa260;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void D3MFExporter::exportContentTyp( const std::string &filename ) {
    if ( nullptr == m_zipArchive ) {
        throw DeadlyExportError( "3MF-Export: Zip archive not valid, nullptr." );
    }
    const std::string entry = filename;
    zip_entry_open( m_zipArchive, entry.c_str() );

    const std::string &exportTxt( mContentOutput.str() );
    zip_entry_write( m_zipArchive, exportTxt.c_str(), exportTxt.size() );

    zip_entry_close( m_zipArchive );
}